

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalTree.h
# Opt level: O0

IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> * __thiscall
IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::operator=
          (IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *this,intervalTree *other)

{
  bool bVar1;
  undefined1 local_28 [8];
  intervalTree *local_18;
  intervalTree *other_local;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *this_local;
  
  this->center = other->center;
  local_18 = other;
  other_local = this;
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::operator=(&this->intervals,&other->intervals);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->left);
  if (bVar1) {
    std::
    unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
    ::operator*(&local_18->left);
    copyTree((IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)&stack0xffffffffffffffe0,
             this);
  }
  else {
    std::
    unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>,std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>>
    ::unique_ptr<std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>,void>
              ((unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>,std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>>
                *)&stack0xffffffffffffffe0,(nullptr_t)0x0);
  }
  std::
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::operator=(&this->left,
              (unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               *)&stack0xffffffffffffffe0);
  std::
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                 *)&stack0xffffffffffffffe0);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->right);
  if (bVar1) {
    std::
    unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
    ::operator*(&local_18->right);
    copyTree((IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long> *)local_28,this);
  }
  else {
    std::
    unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>,std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>>
    ::unique_ptr<std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>,void>
              ((unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>,std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,unsigned_long>>>
                *)local_28,(nullptr_t)0x0);
  }
  std::
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::operator=(&this->right,
              (unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
               *)local_28);
  std::
  unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~unique_ptr((unique_ptr<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>,_std::default_delete<IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                 *)local_28);
  return this;
}

Assistant:

IntervalTree<T,K>& operator=(const intervalTree& other) {
        center = other.center;
        intervals = other.intervals;
        left = other.left ? copyTree(*other.left) : nullptr;
        right = other.right ? copyTree(*other.right) : nullptr;
        return *this;
    }